

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDesc.cpp
# Opt level: O0

Expected<renderdesc::Command::Flag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
renderdesc::flagFromValue_abi_cxx11_
          (Expected<renderdesc::Command::Flag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,renderdesc *this,Value *v)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  reference_wrapper *this_00;
  undefined8 uVar2;
  string local_e8;
  Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c8;
  Flag local_a8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a0;
  string *s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  undefined1 local_40 [8];
  ExpectedRef<const_std::string,_std::string> s_result;
  Value *v_local;
  
  s_result._32_8_ = this;
  yaml::Value::getString_abi_cxx11_
            ((ExpectedRef<const_std::string,_std::string> *)local_40,(Value *)this);
  bVar1 = ::Expected::operator_cast_to_bool((Expected *)local_40);
  if (bVar1) {
    this_00 = (reference_wrapper *)
              Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::value((Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_40);
    local_a0 = std::reference_wrapper::operator_cast_to_string_(this_00);
    bVar1 = std::operator==(local_a0,"DepthTest");
    if (bVar1) {
      local_a8[1] = 0;
      Expected<renderdesc::Command::Flag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::Expected(__return_storage_ptr__,local_a8 + 1);
    }
    else {
      bVar1 = std::operator==(local_a0,"VertexProgramPointSize");
      if (bVar1) {
        local_a8[0] = VertexProgramPointSize;
        Expected<renderdesc::Command::Flag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::Expected(__return_storage_ptr__,local_a8);
      }
      else {
        uVar2 = std::__cxx11::string::c_str();
        format_abi_cxx11_(&local_e8,"Unknown flag %s",uVar2);
        Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::Unexpected(&local_c8,&local_e8);
        Expected<renderdesc::Command::Flag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::Expected(__return_storage_ptr__,&local_c8);
        Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~Unexpected(&local_c8);
        std::__cxx11::string::~string((string *)&local_e8);
      }
    }
  }
  else {
    __rhs = Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::error((Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_40);
    std::operator+(&local_90,"Cannot read Flag: ",__rhs);
    Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    Unexpected(&local_70,&local_90);
    Expected<renderdesc::Command::Flag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::Expected(__return_storage_ptr__,&local_70);
    Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~Unexpected(&local_70);
    std::__cxx11::string::~string((string *)&local_90);
  }
  s._4_4_ = 1;
  Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Expected((Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_40);
  return __return_storage_ptr__;
}

Assistant:

static Expected<Command::Flag, std::string> flagFromValue(const yaml::Value &v) {
	auto s_result = v.getString();
	if (!s_result)
		return Unexpected("Cannot read Flag: " + s_result.error());

	const std::string &s = s_result.value();
	if (s == "DepthTest") return Command::Flag::DepthTest;
#ifndef ATTO_PLATFORM_RPI
	if (s == "VertexProgramPointSize") return Command::Flag::VertexProgramPointSize;
#endif

	return Unexpected(format("Unknown flag %s", s.c_str()));
}